

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall arealights::Application::createFramebuffer(Application *this,ivec2 *resolution)

{
  GLenum GVar1;
  Writer *pWVar2;
  Writer local_90;
  GLuint local_1c;
  ivec2 *piStack_18;
  uint rboDepth;
  ivec2 *resolution_local;
  Application *this_local;
  
  piStack_18 = resolution;
  resolution_local = (ivec2 *)this;
  (*glad_glGenFramebuffers)(1,&this->_intermediateFBO);
  (*glad_glBindFramebuffer)(0x8d40,this->_intermediateFBO);
  (*glad_glGenTextures)(1,&this->_intermediateFBOTexture);
  (*glad_glBindTexture)(0xde1,this->_intermediateFBOTexture);
  (*glad_glTexImage2D)
            (0xde1,0,0x881a,(piStack_18->field_0).field_0.x,(piStack_18->field_0).field_0.y,0,0x1908
             ,0x1406,(void *)0x0);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,this->_intermediateFBOTexture,0);
  (*glad_glGenRenderbuffers)(1,&local_1c);
  (*glad_glBindRenderbuffer)(0x8d41,local_1c);
  (*glad_glRenderbufferStorage)
            (0x8d41,0x88f0,(piStack_18->field_0).field_0.x,(piStack_18->field_0).field_0.y);
  (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,local_1c);
  GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar1 != 0x8cd5) {
    el::base::Writer::Writer
              (&local_90,Error,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
               ,0x87,"void arealights::Application::createFramebuffer(const glm::ivec2 &)",NormalLog
               ,0);
    pWVar2 = el::base::Writer::construct(&local_90,1,"framework");
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [26])"Framebuffer not complete!");
    el::base::Writer::operator<<(pWVar2,std::endl<char,std::char_traits<char>>);
    el::base::Writer::~Writer(&local_90);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Application::createFramebuffer(const glm::ivec2 &resolution)
{
    glGenFramebuffers(1, &_intermediateFBO);
    glBindFramebuffer(GL_FRAMEBUFFER, _intermediateFBO);

    glGenTextures(1, &_intermediateFBOTexture);
    glBindTexture(GL_TEXTURE_2D, _intermediateFBOTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA16F, resolution.x, resolution.y, 0, GL_RGBA, GL_FLOAT, nullptr);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, _intermediateFBOTexture, 0);

    unsigned int rboDepth;
    glGenRenderbuffers(1, &rboDepth);
    glBindRenderbuffer(GL_RENDERBUFFER, rboDepth);
    glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, resolution.x, resolution.y);
    glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rboDepth);

    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
            LOG(ERROR) << "Framebuffer not complete!" << std::endl;
        }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
}